

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O0

Var Js::Math::FloorDouble(double d,ScriptContext *scriptContext)

{
  bool bVar1;
  BOOL BVar2;
  Var pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int64 local_28;
  intptr_t intResult;
  ScriptContext *scriptContext_local;
  double d_local;
  
  if (d < 0.0) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = d;
    auVar5 = roundsd(auVar5,auVar5,9);
    scriptContext_local = auVar5._0_8_;
    local_28 = (int64)(double)scriptContext_local;
  }
  else {
    local_28 = (int64)d;
    scriptContext_local = (ScriptContext *)d;
  }
  bVar1 = TaggedInt::IsOverflow(local_28);
  if ((!bVar1) && (BVar2 = JavascriptNumber::IsNegZero((double)scriptContext_local), BVar2 == 0)) {
    pvVar3 = JavascriptNumber::ToVar(local_28,scriptContext);
    return pvVar3;
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = scriptContext_local;
  auVar5 = roundsd(auVar4,auVar4,9);
  pvVar3 = JavascriptNumber::ToVarNoCheck(auVar5._0_8_,scriptContext);
  return pvVar3;
}

Assistant:

Var inline Math::FloorDouble(double d, ScriptContext *scriptContext)
    {
            // xplat-todo: use intrinsics here on linux
#ifdef _MSC_VER
#if defined(_M_IX86) || defined(_M_X64)
        if (AutoSystemInfo::Data.SSE4_1Available())
        {
            __m128d input, output;

            int intResult;

            input = _mm_load_sd(&d);
            if (d >= 0.0)
            {
                output = input;
            }
            else
            {
                output = _mm_floor_sd(input, input);
            }
            intResult = _mm_cvttsd_si32(output);

            if (TaggedInt::IsOverflow(intResult) || intResult == 0x80000000 || JavascriptNumber::IsNegZero(d))
            {
                double dblResult;
                if (d >= 0.0)
                {
                    output = _mm_floor_sd(output, input);
                }
                _mm_store_sd(&dblResult, output);

                Assert(dblResult == ::floor(d) || Js::JavascriptNumber::IsNan(dblResult));

                return JavascriptNumber::ToVarNoCheck(dblResult, scriptContext);
            }
            else
            {
                Assert(intResult == (int)::floor(d));
                return JavascriptNumber::ToVar(intResult, scriptContext);
            }
        }
        else
#endif
#endif
        {
            intptr_t intResult;

            if (d >= 0.0)
            {
                intResult = (intptr_t)d;
            }
            else
            {
                d = ::floor(d);
                intResult = (intptr_t)d;
            }

            if (TaggedInt::IsOverflow(intResult) || JavascriptNumber::IsNegZero(d))
            {
                return JavascriptNumber::ToVarNoCheck(::floor(d), scriptContext);
            }
            else
            {
                return JavascriptNumber::ToVar(intResult, scriptContext);
            }
        }
    }